

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

VkShaderStageFlagBits Diligent::ShaderTypeToVkShaderStageFlagBit(SHADER_TYPE ShaderType)

{
  SHADER_TYPE SVar1;
  string msg;
  string local_38;
  
  SVar1 = ShaderType - SHADER_TYPE_VERTEX;
  if ((ShaderType ^ SVar1) <= SVar1) {
    FormatString<char[39]>(&local_38,(char (*) [39])"More than one shader type is specified");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"ShaderTypeToVkShaderStageFlagBit",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x677);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((int)ShaderType < 0x100) {
    if ((int)ShaderType < 0x10) {
      switch(SVar1) {
      case SHADER_TYPE_UNKNOWN:
        return ShaderType;
      case SHADER_TYPE_VERTEX:
        return VK_SHADER_STAGE_FRAGMENT_BIT;
      case SHADER_TYPE_VS_PS:
        return VK_SHADER_STAGE_GEOMETRY_BIT;
      case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VS_PS:
        return VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
      }
    }
    else if ((int)ShaderType < 0x40) {
      if (ShaderType == SHADER_TYPE_DOMAIN) {
        return VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
      }
      if (ShaderType == SHADER_TYPE_COMPUTE) {
        return VK_SHADER_STAGE_COMPUTE_BIT;
      }
    }
    else {
      if (ShaderType == SHADER_TYPE_AMPLIFICATION) {
        return VK_SHADER_STAGE_TASK_BIT_EXT;
      }
      if (ShaderType == SHADER_TYPE_MESH) {
        return VK_SHADER_STAGE_MESH_BIT_EXT;
      }
    }
  }
  else if ((int)ShaderType < 0x800) {
    if (ShaderType == SHADER_TYPE_RAY_GEN) {
      return VK_SHADER_STAGE_RAYGEN_BIT_KHR;
    }
    if (ShaderType == SHADER_TYPE_RAY_MISS) {
      return VK_SHADER_STAGE_MISS_BIT_KHR;
    }
    if (ShaderType == SHADER_TYPE_RAY_CLOSEST_HIT) {
      return VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR;
    }
  }
  else if ((int)ShaderType < 0x2000) {
    if (ShaderType == SHADER_TYPE_RAY_ANY_HIT) {
      return VK_SHADER_STAGE_ANY_HIT_BIT_KHR;
    }
    if (ShaderType == SHADER_TYPE_RAY_INTERSECTION) {
      return VK_SHADER_STAGE_INTERSECTION_BIT_KHR;
    }
  }
  else {
    if (ShaderType == SHADER_TYPE_CALLABLE) {
      return VK_SHADER_STAGE_CALLABLE_BIT_KHR;
    }
    if (ShaderType == SHADER_TYPE_LAST) {
      FormatString<char[24]>(&local_38,(char (*) [24])"Unsupported shader type");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"ShaderTypeToVkShaderStageFlagBit",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x68b);
      goto LAB_0027720e;
    }
  }
  FormatString<char[20]>(&local_38,(char (*) [20])"Unknown shader type");
  DebugAssertionFailed
            (local_38._M_dataplus._M_p,"ShaderTypeToVkShaderStageFlagBit",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
             ,0x68e);
LAB_0027720e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return VK_SHADER_STAGE_ALL;
}

Assistant:

VkShaderStageFlagBits ShaderTypeToVkShaderStageFlagBit(SHADER_TYPE ShaderType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    VERIFY(IsPowerOfTwo(Uint32{ShaderType}), "More than one shader type is specified");
    switch (ShaderType)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           return VK_SHADER_STAGE_VERTEX_BIT;
        case SHADER_TYPE_HULL:             return VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
        case SHADER_TYPE_DOMAIN:           return VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
        case SHADER_TYPE_GEOMETRY:         return VK_SHADER_STAGE_GEOMETRY_BIT;
        case SHADER_TYPE_PIXEL:            return VK_SHADER_STAGE_FRAGMENT_BIT;
        case SHADER_TYPE_COMPUTE:          return VK_SHADER_STAGE_COMPUTE_BIT;
        case SHADER_TYPE_AMPLIFICATION:    return VK_SHADER_STAGE_TASK_BIT_EXT;
        case SHADER_TYPE_MESH:             return VK_SHADER_STAGE_MESH_BIT_EXT;
        case SHADER_TYPE_RAY_GEN:          return VK_SHADER_STAGE_RAYGEN_BIT_KHR;
        case SHADER_TYPE_RAY_MISS:         return VK_SHADER_STAGE_MISS_BIT_KHR;
        case SHADER_TYPE_RAY_CLOSEST_HIT:  return VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR;
        case SHADER_TYPE_RAY_ANY_HIT:      return VK_SHADER_STAGE_ANY_HIT_BIT_KHR;
        case SHADER_TYPE_RAY_INTERSECTION: return VK_SHADER_STAGE_INTERSECTION_BIT_KHR;
        case SHADER_TYPE_CALLABLE:         return VK_SHADER_STAGE_CALLABLE_BIT_KHR;
        // clang-format on
        case SHADER_TYPE_TILE:
            UNEXPECTED("Unsupported shader type");
            return VK_SHADER_STAGE_FLAG_BITS_MAX_ENUM;
        default:
            UNEXPECTED("Unknown shader type");
            return VK_SHADER_STAGE_FLAG_BITS_MAX_ENUM;
    }
}